

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.c
# Opt level: O0

void shock_effect(void *vo,int level,int dam,int target)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  OBJ_DATA *in_RDI;
  char *msg;
  int chance;
  OBJ_DATA *obj_2;
  OBJ_DATA *obj_next_1;
  OBJ_DATA *obj_1;
  CHAR_DATA *victim;
  OBJ_DATA *obj_next;
  OBJ_DATA *obj;
  ROOM_INDEX_DATA *room;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  int in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  int iVar6;
  int iVar7;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  char *format;
  int local_54;
  long local_40;
  OBJ_DATA *local_28;
  undefined8 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe8;
  
  if (in_ECX == 2) {
    local_28 = in_RDI->on;
    iVar2 = 2;
    while (local_28 != (OBJ_DATA *)0x0) {
      local_28 = local_28->next_content;
      shock_effect((void *)CONCAT44(in_ESI,in_EDX),iVar2,in_stack_ffffffffffffffe8,
                   (int)((ulong)in_RDI >> 0x20));
    }
  }
  else if (in_ECX == 0) {
    local_40 = *(long *)&in_RDI->item_type;
    iVar2 = 0;
    while (local_40 != 0) {
      local_40 = *(long *)(local_40 + 8);
      shock_effect((void *)CONCAT44(in_ESI,in_EDX),iVar2,in_stack_ffffffffffffffe8,
                   (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
    }
  }
  else if ((((in_ECX == 1) &&
            (bVar1 = is_obj_stat((OBJ_DATA *)
                                 CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                                 in_stack_ffffffffffffff94), !bVar1)) &&
           (bVar1 = is_obj_stat((OBJ_DATA *)
                                CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                                in_stack_ffffffffffffff94), !bVar1)) &&
          (iVar2 = number_range(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c), iVar2 != 0)) {
    iVar2 = in_ESI / 4;
    local_54 = iVar2 + in_EDX / 10;
    if (0x19 < local_54) {
      local_54 = (local_54 + -0x19) / 2 + 0x19;
    }
    if (0x32 < local_54) {
      local_54 = (local_54 + -0x32) / 2 + 0x32;
    }
    bVar1 = is_obj_stat((OBJ_DATA *)CONCAT44(iVar2,in_stack_ffffffffffffff98),
                        in_stack_ffffffffffffff94);
    if (bVar1) {
      local_54 = local_54 + -5;
    }
    iVar3 = (int)in_RDI->item_type;
    if (iVar3 - 3U < 2) {
      iVar4 = local_54 + in_RDI->level * -2 + 10;
      format = "$p overloads and explodes!";
      if (iVar4 < 5) {
        iVar4 = in_stack_ffffffffffffff90;
        iVar6 = 5;
      }
      else {
        iVar6 = iVar4;
        if (0x5f < iVar4) {
          iVar4 = 0x5f;
          iVar6 = iVar4;
        }
      }
      iVar7 = iVar6;
      iVar5 = number_percent();
      if (iVar5 <= iVar6) {
        if (in_RDI->carried_by == (CHAR_DATA *)0x0) {
          if ((in_RDI->in_room != (ROOM_INDEX_DATA *)0x0) &&
             (in_RDI->in_room->people != (CHAR_DATA *)0x0)) {
            act(format,(CHAR_DATA *)CONCAT44(iVar2,iVar3),(void *)CONCAT44(iVar7,iVar4),
                (void *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),0);
          }
        }
        else {
          act(format,(CHAR_DATA *)CONCAT44(iVar2,iVar3),(void *)CONCAT44(iVar7,iVar4),
              (void *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),0);
        }
        extract_obj(in_RDI);
      }
    }
  }
  return;
}

Assistant:

void shock_effect(void *vo, int level, int dam, int target)
{
	if (target == TARGET_ROOM)
	{
		ROOM_INDEX_DATA *room = (ROOM_INDEX_DATA *)vo;
		OBJ_DATA *obj, *obj_next;

		for (obj = room->contents; obj != nullptr; obj = obj_next)
		{
			obj_next = obj->next_content;
			shock_effect(obj, level, dam, TARGET_OBJ);
		}

		return;
	}

	if (target == TARGET_CHAR)
	{
		CHAR_DATA *victim = (CHAR_DATA *)vo;
		OBJ_DATA *obj, *obj_next;

		/* toast some gear */
		for (obj = victim->carrying; obj != nullptr; obj = obj_next)
		{
			obj_next = obj->next_content;
			shock_effect(obj, level, dam, TARGET_OBJ);
		}

		return;
	}

	if (target == TARGET_OBJ)
	{
		OBJ_DATA *obj = (OBJ_DATA *)vo;
		int chance;
		char *msg;

		if (is_obj_stat(obj, ITEM_BURN_PROOF) || is_obj_stat(obj, ITEM_NOPURGE) || number_range(0, 4) == 0)
			return;

		chance = level / 4 + dam / 10;

		if (chance > 25)
			chance = (chance - 25) / 2 + 25;

		if (chance > 50)
			chance = (chance - 50) / 2 + 50;

		if (is_obj_stat(obj, ITEM_BLESS))
			chance -= 5;

		chance -= obj->level * 2;

		switch (obj->item_type)
		{
			case ITEM_WAND:
			case ITEM_STAFF:
				chance += 10;
				msg = "$p overloads and explodes!";
				break;
			case ITEM_JEWELRY:
				chance -= 10;
				msg = "$p is fused into a worthless lump.";
			default:
				return;
		}

		chance = URANGE(5, chance, 95);

		if (number_percent() > chance)
			return;

		if (obj->carried_by != nullptr)
			act(msg, obj->carried_by, obj, nullptr, TO_ALL);
		else if (obj->in_room != nullptr && obj->in_room->people != nullptr)
			act(msg, obj->in_room->people, obj, nullptr, TO_ALL);

		extract_obj(obj);
	}
}